

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::read_dht_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint8 *puVar4;
  byte local_248 [4];
  int s;
  bool symbol_present [256];
  uint local_13c;
  undefined1 local_138 [4];
  uint num_left;
  uint8 huff_val [256];
  uint8 huff_num [17];
  int local_1c;
  int count;
  int index;
  int i;
  jpeg_decoder *this_local;
  
  uVar1 = get_bits(this,0x10);
  if (uVar1 < 2) {
    stop_decoding(this,JPGD_BAD_DHT_MARKER);
  }
  local_13c = uVar1 - 2;
  while( true ) {
    if (local_13c == 0) {
      return;
    }
    uVar1 = get_bits(this,8);
    huff_val[0xf8] = '\0';
    local_1c = 0;
    for (count = 1; count < 0x11; count = count + 1) {
      uVar2 = get_bits(this,8);
      huff_val[(long)count + 0xf8] = (uint8)uVar2;
      local_1c = (uint)huff_val[(long)count + 0xf8] + local_1c;
    }
    if (0xff < local_1c) {
      stop_decoding(this,JPGD_BAD_DHT_COUNTS);
    }
    memset(local_248,0,0x100);
    for (count = 0; count < local_1c; count = count + 1) {
      uVar2 = get_bits(this,8);
      if ((local_248[(int)uVar2] & 1) != 0) {
        stop_decoding(this,JPGD_BAD_DHT_COUNTS);
      }
      local_138[count] = (char)uVar2;
      local_248[(int)uVar2] = 1;
    }
    if (local_13c < local_1c + 0x11U) {
      stop_decoding(this,JPGD_BAD_DHT_MARKER);
    }
    local_13c = local_13c - (local_1c + 0x11U);
    if (0x10 < (uVar1 & 0x10)) break;
    uVar3 = (uVar1 & 0xf) + ((int)(uVar1 & 0x10) >> 4) * 4;
    if (7 < uVar3) {
      stop_decoding(this,JPGD_BAD_DHT_INDEX);
    }
    if (this->m_huff_num[(int)uVar3] == (uint8 *)0x0) {
      puVar4 = (uint8 *)alloc(this,0x11,false);
      this->m_huff_num[(int)uVar3] = puVar4;
    }
    if (this->m_huff_val[(int)uVar3] == (uint8 *)0x0) {
      puVar4 = (uint8 *)alloc(this,0x100,false);
      this->m_huff_val[(int)uVar3] = puVar4;
    }
    this->m_huff_ac[(int)uVar3] = (uVar3 & 0x10) != 0;
    puVar4 = this->m_huff_num[(int)uVar3];
    *(ulong *)puVar4 = CONCAT71(huff_val._249_7_,huff_val[0xf8]);
    *(undefined8 *)(puVar4 + 8) = huff_num._0_8_;
    puVar4[0x10] = huff_num[8];
    memcpy(this->m_huff_val[(int)uVar3],local_138,0x100);
  }
  stop_decoding(this,JPGD_BAD_DHT_INDEX);
}

Assistant:

void jpeg_decoder::read_dht_marker()
	{
		int i, index, count;
		uint8 huff_num[17];
		uint8 huff_val[256];

		uint num_left = get_bits(16);

		if (num_left < 2)
			stop_decoding(JPGD_BAD_DHT_MARKER);

		num_left -= 2;

		while (num_left)
		{
			index = get_bits(8);

			huff_num[0] = 0;

			count = 0;

			for (i = 1; i <= 16; i++)
			{
				huff_num[i] = static_cast<uint8>(get_bits(8));
				count += huff_num[i];
			}

			if (count > 255)
				stop_decoding(JPGD_BAD_DHT_COUNTS);

			bool symbol_present[256];
			memset(symbol_present, 0, sizeof(symbol_present));

			for (i = 0; i < count; i++)
			{
				const int s = get_bits(8);

				// Check for obviously bogus tables.
				if (symbol_present[s])
					stop_decoding(JPGD_BAD_DHT_COUNTS);

				huff_val[i] = static_cast<uint8_t>(s);
				symbol_present[s] = true;
			}

			i = 1 + 16 + count;

			if (num_left < (uint)i)
				stop_decoding(JPGD_BAD_DHT_MARKER);

			num_left -= i;

			if ((index & 0x10) > 0x10)
				stop_decoding(JPGD_BAD_DHT_INDEX);

			index = (index & 0x0F) + ((index & 0x10) >> 4) * (JPGD_MAX_HUFF_TABLES >> 1);

			if (index >= JPGD_MAX_HUFF_TABLES)
				stop_decoding(JPGD_BAD_DHT_INDEX);

			if (!m_huff_num[index])
				m_huff_num[index] = (uint8*)alloc(17);

			if (!m_huff_val[index])
				m_huff_val[index] = (uint8*)alloc(256);

			m_huff_ac[index] = (index & 0x10) != 0;
			memcpy(m_huff_num[index], huff_num, 17);
			memcpy(m_huff_val[index], huff_val, 256);
		}
	}